

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall
SGParser::Generator::RegExprDFANode::RegExprDFANode
          (RegExprDFANode *this,NodeType type,uint pos,uint data)

{
  uint local_1c;
  uint local_18;
  uint data_local;
  uint pos_local;
  NodeType type_local;
  RegExprDFANode *this_local;
  
  this->Type = type;
  this->ID = 0;
  this->Position = pos;
  local_1c = data;
  local_18 = pos;
  data_local = type;
  _pos_local = this;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->Chars);
  this->AcceptingState = 0;
  this->Nullable = false;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->FirstPos);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->LastPos);
  this->pParent = (RegExprDFANode *)0x0;
  std::
  vector<SGParser::Generator::RegExprDFANode_*,_std::allocator<SGParser::Generator::RegExprDFANode_*>_>
  ::vector(&this->Children);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->Chars,&local_1c);
  return;
}

Assistant:

RegExprDFANode(NodeType type, unsigned pos, unsigned data)
        : Type{type},
          Position{pos} {
        Chars.push_back(data);
    }